

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

invalid_iterator * __thiscall
nlohmann::detail::invalid_iterator::
create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (invalid_iterator *__return_storage_ptr__,invalid_iterator *this,int id_,string *what_arg,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *context)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long *plVar3;
  size_type *psVar4;
  undefined4 in_register_00000014;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  string local_b0;
  size_type *local_90;
  string w;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 uStack_38;
  
  w.field_2._8_8_ = &local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&w.field_2 + 8),"invalid_iterator","");
  exception::name(&local_b0,(string *)((long)&w.field_2 + 8),(int)this);
  local_c8 = 0;
  local_c0 = 0;
  uVar1 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    uVar1 = local_b0.field_2._M_allocated_capacity;
  }
  local_d0 = &local_c0;
  if ((local_b0._M_string_length < 0x10) && ((ulong)uVar1 < local_b0._M_string_length)) {
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
  }
  else {
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)&local_c0);
  }
  local_50 = &local_40;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_40 = *plVar3;
    uStack_38 = puVar2[3];
  }
  else {
    local_40 = *plVar3;
    local_50 = (long *)*puVar2;
  }
  local_48 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,*(ulong *)CONCAT44(in_register_00000014,id_));
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    w._M_string_length = *psVar4;
    w.field_2._M_allocated_capacity = plVar3[3];
    local_90 = &w._M_string_length;
  }
  else {
    w._M_string_length = *psVar4;
    local_90 = (size_type *)*plVar3;
  }
  w._M_dataplus._M_p = (pointer)plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)w.field_2._8_8_ != &local_60) {
    operator_delete((void *)w.field_2._8_8_,local_60._M_allocated_capacity + 1);
  }
  exception::exception(&__return_storage_ptr__->super_exception,(int)this,(char *)local_90);
  *(undefined ***)&__return_storage_ptr__->super_exception = &PTR__exception_00124bb0;
  if (local_90 != &w._M_string_length) {
    operator_delete(local_90,w._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static invalid_iterator create(int id_, const std::string& what_arg, const BasicJsonType& context)
    {
        std::string w = exception::name("invalid_iterator", id_) + exception::diagnostics(context) + what_arg;
        return invalid_iterator(id_, w.c_str());
    }